

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall
ValueArgumentList::Action
          (ValueArgumentList *this,vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  SymbolName SVar1;
  SymbolType local_2c;
  SymbolName name;
  SymbolType expression_type;
  int state;
  int ret;
  vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type_local;
  ValueArgumentList *this_local;
  
  expression_type = INT;
  name = WHILE_SYM;
  _state = argument_type;
  argument_type_local = (vector<_SymbolType,_std::allocator<_SymbolType>_> *)this;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (name == WHILE_SYM) {
      if (SVar1 == R_CIRCLE_BRACKET_SYM) {
        return 0;
      }
      expression_type = Expression::Action(&this->m_expression,&local_2c);
      if (expression_type != INT) {
        return -1;
      }
      std::vector<_SymbolType,_std::allocator<_SymbolType>_>::push_back(_state,&local_2c);
      name = SWITCH_SYM;
    }
    else if (name == SWITCH_SYM) {
      if (SVar1 != COMMA_SYM) {
        return 0;
      }
      name = IF_SYM;
    }
    else if (name == IF_SYM) {
      expression_type = Expression::Action(&this->m_expression,&local_2c);
      if (expression_type != INT) {
        return -1;
      }
      std::vector<_SymbolType,_std::allocator<_SymbolType>_>::push_back(_state,&local_2c);
      name = SWITCH_SYM;
    }
    if (name != SWITCH_SYM) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode ValueArgumentList::Action(vector<SymbolType>& argument_type) {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    argument_type.push_back(expression_type);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COMMA_SYM) {
                    state = 2;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    argument_type.push_back(expression_type);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        if (state != 1)
            handle_correct_queue->NextSymbol();
    }
}